

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<unsigned_char>,unsigned_char,duckdb::BitOrOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  byte bVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  ulong uVar4;
  sel_t *psVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  byte bVar11;
  ulong uVar12;
  idx_t iVar13;
  ulong uVar14;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_68;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar3 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar7 = 0;
      uVar12 = 0;
      do {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar8 = uVar12 + 0x40;
          if (count <= uVar12 + 0x40) {
            uVar8 = count;
          }
LAB_019ca73b:
          uVar9 = uVar12;
          if (uVar12 < uVar8) {
            bVar6 = *state;
            bVar11 = state[1];
            do {
              bVar1 = pdVar3[uVar12];
              if ((bVar6 & 1) == 0) {
                *state = '\x01';
                bVar6 = 1;
                bVar11 = bVar1;
              }
              else {
                bVar11 = bVar11 | bVar1;
              }
              uVar12 = uVar12 + 1;
            } while (uVar8 != uVar12);
            state[1] = bVar11;
            uVar9 = uVar8;
          }
        }
        else {
          uVar4 = puVar2[uVar7];
          uVar8 = uVar12 + 0x40;
          if (count <= uVar12 + 0x40) {
            uVar8 = count;
          }
          if (uVar4 == 0xffffffffffffffff) goto LAB_019ca73b;
          uVar9 = uVar8;
          if ((uVar4 != 0) && (uVar9 = uVar12, uVar12 < uVar8)) {
            uVar14 = 0;
            do {
              if ((uVar4 >> (uVar14 & 0x3f) & 1) != 0) {
                bVar6 = pdVar3[uVar14 + uVar12];
                if (*state == '\0') {
                  state[1] = bVar6;
                  *state = '\x01';
                }
                else {
                  state[1] = state[1] | bVar6;
                }
              }
              uVar14 = uVar14 + 1;
              uVar9 = uVar8;
            } while (uVar8 - uVar12 != uVar14);
          }
        }
        uVar7 = uVar7 + 1;
        uVar12 = uVar9;
      } while (uVar7 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      bVar6 = *input->data;
      if (*state == '\0') {
        *state = '\x01';
      }
      else {
        bVar6 = bVar6 | state[1];
      }
      state[1] = bVar6;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar5 = (local_68.sel)->sel_vector;
        bVar6 = *state;
        bVar11 = state[1];
        iVar10 = 0;
        do {
          iVar13 = iVar10;
          if (psVar5 != (sel_t *)0x0) {
            iVar13 = (idx_t)psVar5[iVar10];
          }
          bVar1 = local_68.data[iVar13];
          if ((bVar6 & 1) == 0) {
            *state = '\x01';
            bVar6 = 1;
            bVar11 = bVar1;
          }
          else {
            bVar11 = bVar11 | bVar1;
          }
          iVar10 = iVar10 + 1;
        } while (count != iVar10);
        state[1] = bVar11;
      }
    }
    else if (count != 0) {
      psVar5 = (local_68.sel)->sel_vector;
      iVar10 = 0;
      do {
        iVar13 = iVar10;
        if (psVar5 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar5[iVar10];
        }
        if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar13 >> 6]
             >> (iVar13 & 0x3f) & 1) != 0) {
          if (*state == '\0') {
            state[1] = local_68.data[iVar13];
            *state = '\x01';
          }
          else {
            state[1] = state[1] | local_68.data[iVar13];
          }
        }
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}